

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

void __thiscall despot::TagBelief::Update(TagBelief *this,ACT_TYPE action,OBS_TYPE obs)

{
  State *in_RAX;
  long *plVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  State *local_38;
  
  local_38 = in_RAX;
  plVar1 = (long *)(**(code **)(*(long *)this->tag_model_ + 0x108))
                             (this->tag_model_,this,action,obs);
  lVar3 = *(long *)&this->field_0x40;
  lVar4 = *(long *)&this->field_0x48;
  if (lVar4 != lVar3) {
    uVar5 = 0;
    do {
      (**(code **)(*(long *)this->tag_model_ + 0xf0))
                (this->tag_model_,*(undefined8 *)(lVar3 + uVar5 * 8));
      uVar5 = uVar5 + 1;
      lVar3 = *(long *)&this->field_0x40;
      lVar4 = *(long *)&this->field_0x48;
    } while (uVar5 < (ulong)(lVar4 - lVar3 >> 3));
  }
  if (lVar4 != lVar3) {
    *(long *)&this->field_0x48 = lVar3;
  }
  plVar2 = (long *)(**(code **)(*plVar1 + 0x30))(plVar1);
  lVar3 = *plVar2;
  if (plVar2[1] != lVar3) {
    uVar5 = 0;
    do {
      local_38 = (State *)(**(code **)(*(long *)this->tag_model_ + 0xe8))
                                    (this->tag_model_,*(undefined8 *)(lVar3 + uVar5 * 8));
      std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                ((vector<despot::State*,std::allocator<despot::State*>> *)&this->field_0x40,
                 &local_38);
      uVar5 = uVar5 + 1;
      lVar3 = *plVar2;
    } while (uVar5 < (ulong)(plVar2[1] - lVar3 >> 3));
  }
  (**(code **)(*plVar1 + 8))(plVar1);
  return;
}

Assistant:

void TagBelief::Update(ACT_TYPE action, OBS_TYPE obs) {
	Belief* updated = tag_model_->Tau(this, action, obs);

	for (int i = 0; i < particles_.size(); i++)
		tag_model_->Free(particles_[i]);
	particles_.clear();

	const vector<State*>& new_particles =
		static_cast<ParticleBelief*>(updated)->particles();
	for (int i = 0; i < new_particles.size(); i++)
		particles_.push_back(tag_model_->Copy(new_particles[i]));

	delete updated;
}